

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_parse.cpp
# Opt level: O3

void ParseDecorate(FScanner *sc)

{
  byte *pbVar1;
  PInt *pPVar2;
  PBool *pPVar3;
  PFloat *pPVar4;
  PStatePointer *pPVar5;
  FString statename;
  bool bVar6;
  char cVar7;
  int iVar8;
  int iVar9;
  char *pcVar10;
  char *pcVar11;
  PClassActor *pPVar12;
  PSymbol *pPVar13;
  FxExpression *pFVar14;
  PPointer *pPVar15;
  PArray *type;
  long lVar16;
  FPropertyInfo *pFVar17;
  FString *pFVar18;
  FxDamageValue *pFVar19;
  FxIntCast *this;
  PClassActor *pPVar20;
  FState *pFVar21;
  PFloat **ppPVar22;
  EDefinitionType def;
  undefined1 uVar23;
  byte *pbVar24;
  undefined1 uVar25;
  uint uVar26;
  PFloat *pPVar27;
  SWORD SVar28;
  int iVar29;
  bool bVar30;
  SavedPos SVar31;
  TArray<PType_*,_PType_*> rets;
  FPropParam pref;
  FScanner newscanner;
  FxDamageValue *local_198;
  PClassActor *local_190;
  undefined1 local_188 [8];
  FString FStack_180;
  undefined8 local_178;
  FString local_170;
  PSymbolTable *local_168;
  SavedPos local_160;
  PClassActor *local_150;
  _func_int **local_148;
  FPropertyInfo *local_140;
  AActor *local_138;
  undefined1 local_130 [9];
  undefined7 uStack_127;
  undefined2 local_120;
  int local_11c;
  int local_118;
  undefined1 local_110 [56];
  DDropItem *local_d8;
  FScriptPosition local_d0 [10];
  
  SVar31 = FScanner::SavePos(sc);
  local_160.SavedScriptPtr = SVar31.SavedScriptPtr;
  local_160.SavedScriptLine = SVar31.SavedScriptLine;
  bVar6 = FScanner::GetToken(sc);
  if (bVar6) {
    local_150 = (PClassActor *)FString::NullString.Nothing;
    local_148 = (_func_int **)&PTR__FxConstant_0088f2f0;
    do {
      iVar8 = sc->TokenType;
      if (iVar8 < 0x127) {
        if (iVar8 == 0x3b) {
          FScanner::ScriptError(sc,"Unexpected \';\'");
        }
        else {
          if (iVar8 == 0x101) {
            bVar6 = FScanner::Compare(sc,"ACTOR");
            if (bVar6) {
              local_130._0_8_ = local_150;
              local_110._40_8_ = (FState *)0x0;
              local_110._48_8_ = (char *)0x0;
              local_110._16_8_ = (char *)0x0;
              local_110._24_8_ = (FState *)0x0;
              local_110._0_8_ = (FStateDefine *)0x0;
              local_110._8_4_ = 0;
              local_110._12_4_ = 0;
              local_110._32_8_ = (char *)0xffffffffffffffff;
              local_d0[0].FileName.Chars = (char *)local_150;
              FString::NullString.RefCount = FString::NullString.RefCount + 2;
              local_d0[0].ScriptLine = 0;
              FScanner::MustGetString(sc);
              pcVar10 = sc->String;
              pcVar11 = strchr(pcVar10,0x3a);
              if (pcVar11 == (char *)0x0) {
                iVar8 = FName::NameManager::FindName(&FName::NameData,pcVar10,false);
                local_190 = (PClassActor *)CONCAT44(local_190._4_4_,iVar8);
                FScanner::MustGetString(sc);
                pcVar11 = sc->String;
                if (*pcVar11 == ':') goto LAB_0069cc0d;
LAB_0069cc3c:
                FScanner::UnGet(sc);
                iVar8 = FName::NameManager::FindName(&FName::NameData,(char *)0x0,false);
              }
              else {
                *pcVar11 = '\0';
                iVar8 = FName::NameManager::FindName(&FName::NameData,sc->String,false);
                local_190 = (PClassActor *)CONCAT44(local_190._4_4_,iVar8);
LAB_0069cc0d:
                if (pcVar11[1] == '\0') {
                  FScanner::MustGetString(sc);
                  pcVar11 = sc->String;
                  if (pcVar11 == (char *)0x0) goto LAB_0069cc3c;
                }
                else {
                  pcVar11 = pcVar11 + 1;
                }
                iVar8 = FName::NameManager::FindName(&FName::NameData,pcVar11,false);
              }
              bVar6 = FScanner::CheckString(sc,"replaces");
              local_168 = (PSymbolTable *)(long)(int)local_190;
              iVar9 = 0;
              if (bVar6) {
                FScanner::MustGetString(sc);
                iVar9 = FName::NameManager::FindName(&FName::NameData,sc->String,false);
                if (iVar9 == (int)local_190) {
                  FScanner::ScriptMessage
                            (sc,"Cannot replace class %s with itself",
                             FName::NameData.NameArray[(long)local_168].Text);
                  FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
                  iVar9 = (int)local_190;
                }
              }
              FScanner::SetCMode(sc,true);
              bVar6 = FScanner::CheckNumber(sc);
              iVar29 = -1;
              if ((bVar6) && (iVar29 = sc->Number, 0x8000 < iVar29 + 1U)) {
                FScanner::ScriptMessage(sc,"DoomEdNum must be in the range [-1,32767]");
                FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
                iVar29 = -1;
              }
              bVar6 = FScanner::CheckString(sc,"native");
              FScriptPosition::FScriptPosition((FScriptPosition *)local_188,sc);
              local_198 = (FxDamageValue *)CONCAT44(local_198._4_4_,(int)local_190);
              local_178 = (LumpRecord *)CONCAT44(local_178._4_4_,iVar8);
              pPVar12 = CreateNewActor((FScriptPosition *)local_188,(FName *)&local_198,
                                       (FName *)&local_178,bVar6);
              FString::~FString((FString *)local_188);
              SVar28 = (SWORD)iVar29;
              if (iVar29 < 1) {
                SVar28 = -1;
              }
              pPVar12->DoomEdNum = SVar28;
              FWadCollection::GetLumpFullPath((FWadCollection *)local_188,0xaad1d0);
              FString::operator=(&pPVar12->SourceLumpName,(FString *)local_188);
              FString::~FString((FString *)local_188);
              local_188._0_4_ = iVar9;
              SetReplacement(sc,pPVar12,(FName *)local_188);
              if (pPVar12 == (PClassActor *)AActor::RegistrationInfo.MyClass) {
                pPVar20 = (PClassActor *)0x0;
              }
              else {
                pPVar20 = (PClassActor *)(pPVar12->super_PClass).ParentClass;
              }
              local_d8 = (DDropItem *)0x0;
              local_120._0_1_ = false;
              local_120._1_1_ = false;
              local_11c = 0;
              FStateDefinitions::MakeStateDefines((FStateDefinitions *)local_110,pPVar20);
              local_118 = sc->LumpNum;
              unique0x10001d58 = pPVar12;
              FString::operator=((FString *)local_130,
                                 FName::NameData.NameArray[(long)local_168].Text);
              FScanner::MustGetToken(sc,0x7b);
              local_168 = &(pPVar12->super_PClass).super_PStruct.super_PNamedType.
                           super_PCompoundType.super_PType.Symbols;
              local_190 = pPVar12;
LAB_0069ce4e:
              FScanner::MustGetAnyToken(sc);
              iVar8 = sc->TokenType;
              if (0x126 < iVar8) {
                if (0x152 < iVar8) {
                  if (iVar8 == 0x153) {
                    FStack_180.Chars = (char *)0x1;
                    local_188 = (undefined1  [8])
                                M_Malloc_Dbg(8,
                                             "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/./tarray.h"
                                             ,0x91);
                    if ((sc->LumpNum == -1) ||
                       (iVar8 = FWadCollection::GetLumpFile(&Wads,sc->LumpNum), 0 < iVar8)) {
                      FScanner::ScriptMessage(sc,"functions can only be declared by native actors!")
                      ;
                      FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
                    }
                    FScanner::MustGetAnyToken(sc);
                    pPVar5 = TypeState;
                    pPVar4 = TypeFloat64;
                    pPVar3 = TypeBool;
                    pPVar27 = (PFloat *)TypeSInt32;
                    iVar8 = sc->TokenType;
                    if (iVar8 < 0x13a) {
                      if (iVar8 != 0x101) {
                        if (iVar8 == 0x132) {
                          TArray<PType_*,_PType_*>::Grow((TArray<PType_*,_PType_*> *)local_188,1);
                          pPVar27 = (PFloat *)pPVar3;
                        }
                        else {
                          if (iVar8 != 0x133) {
LAB_0069d443:
                            FScanner::ScriptError(sc,"Invalid return type %s",sc->String);
                            goto LAB_0069d4ba;
                          }
                          TArray<PType_*,_PType_*>::Grow((TArray<PType_*,_PType_*> *)local_188,1);
                          pPVar27 = pPVar4;
                        }
                        goto LAB_0069d470;
                      }
                      pPVar15 = NewPointer((PType *)DObject::RegistrationInfo.MyClass);
                      TArray<PType_*,_PType_*>::Grow((TArray<PType_*,_PType_*> *)local_188,1);
                      (&(((PBasicType *)local_188)->super_PType).super_DObject._vptr_DObject)
                      [FStack_180.Chars._4_4_] = (_func_int **)pPVar15;
                      FStack_180.Chars._4_4_ = FStack_180.Chars._4_4_ + 1;
                      FScanner::ScriptError(sc,"Object type variables not implemented yet!");
                    }
                    else {
                      if (iVar8 == 0x13a) {
                        TArray<PType_*,_PType_*>::Grow((TArray<PType_*,_PType_*> *)local_188,1);
                      }
                      else {
                        if (iVar8 == 0x13e) goto LAB_0069d484;
                        if (iVar8 != 0x146) goto LAB_0069d443;
                        TArray<PType_*,_PType_*>::Grow((TArray<PType_*,_PType_*> *)local_188,1);
                        pPVar27 = (PFloat *)pPVar5;
                      }
LAB_0069d470:
                      (&(((PBasicType *)local_188)->super_PType).super_DObject._vptr_DObject)
                      [FStack_180.Chars._4_4_] = (_func_int **)pPVar27;
                      FStack_180.Chars._4_4_ = FStack_180.Chars._4_4_ + 1;
                    }
LAB_0069d484:
                    FScanner::MustGetToken(sc,0x101);
                    iVar8 = FName::NameManager::FindName(&FName::NameData,sc->String,false);
                    local_198 = (FxDamageValue *)CONCAT44(local_198._4_4_,iVar8);
                    ParseFunctionDef(sc,local_190,(FName *)&local_198,
                                     (TArray<PType_*,_PType_*> *)local_188,2);
                    goto LAB_0069d4ba;
                  }
                  if (iVar8 != 0x154) {
                    if (iVar8 != 0x17a) goto LAB_0069d3b2;
                    if (local_120._1_1_ == true) {
                      FScanner::ScriptMessage
                                (sc,"\'%s\' contains multiple state declarations",
                                 FName::NameData.NameArray
                                 [(stack0xfffffffffffffed8->super_PClass).super_PStruct.
                                  super_PNamedType.TypeName.Index].Text);
                      FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
                    }
                    ParseStates(sc,stack0xfffffffffffffed8,
                                (AActor *)(stack0xfffffffffffffed8->super_PClass).Defaults,
                                (Baggage *)local_130);
                    local_120._1_1_ = true;
                    goto LAB_0069ce4e;
                  }
                  if ((local_190->super_PClass).bRuntimeClass == false) {
                    FScanner::ScriptError(sc,"Native classes may not have user variables");
                  }
                  FScanner::MustGetAnyToken(sc);
                  iVar8 = sc->TokenType;
                  if ((iVar8 != 0x133) && (iVar8 != 0x13a)) {
                    FScanner::ScriptMessage
                              (sc,"User variables must be of type \'int\' or \'float\'");
                    FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
                    iVar8 = sc->TokenType;
                  }
                  ppPVar22 = &TypeFloat64;
                  if (iVar8 == 0x13a) {
                    ppPVar22 = (PFloat **)&TypeSInt32;
                  }
                  type = (PArray *)*ppPVar22;
                  FScanner::MustGetToken(sc,0x101);
                  if (sc->StringLen < 6) {
LAB_0069d198:
                    FScanner::ScriptMessage(sc,"User variable names must begin with \"user_\"");
                    FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
                    pcVar10 = sc->String;
                  }
                  else {
                    pcVar10 = sc->String;
                    iVar8 = strncasecmp("user_",pcVar10,5);
                    if (iVar8 != 0) goto LAB_0069d198;
                  }
                  iVar8 = FName::NameManager::FindName(&FName::NameData,pcVar10,false);
                  local_198 = (FxDamageValue *)CONCAT44(local_198._4_4_,iVar8);
                  pPVar13 = PSymbolTable::FindSymbol(local_168,(FName *)&local_198,true);
                  pcVar10 = "\'%s\' is already defined in \'%s\' or one of its ancestors.";
                  if (pPVar13 == (PSymbol *)0x0) {
                    bVar6 = FScanner::CheckToken(sc,0x5b);
                    if (bVar6) {
                      pFVar14 = ParseExpression(sc,local_190,true);
                      pcVar10 = "Error while resolving array size";
                      if (pFVar14 == (FxExpression *)0x0) {
LAB_0069d4c7:
                        FScanner::ScriptMessage(sc,pcVar10);
                        FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
                        uVar26 = 1;
                        FScanner::MustGetToken(sc,0x5d);
                      }
                      else {
                        iVar9 = (*pFVar14->_vptr_FxExpression[3])(pFVar14);
                        pcVar10 = "Array size must be a constant";
                        if ((char)iVar9 == '\0') goto LAB_0069d4c7;
                        local_188 = (undefined1  [8])pFVar14[1]._vptr_FxExpression;
                        if (local_188 == (undefined1  [8])TypeString) {
                          FString::AttachToOther(&FStack_180,(FString *)&pFVar14[1].JumpAddresses);
                        }
                        else {
                          FStack_180.Chars = (char *)pFVar14[1].JumpAddresses.Array;
                        }
                        iVar9 = (*(((PBasicType *)local_188)->super_PType).super_DObject.
                                  _vptr_DObject[0x12])();
                        if (iVar9 == 1) {
                          uVar26 = (uint)(double)FStack_180.Chars;
                        }
                        else {
                          uVar26 = 0;
                          if (iVar9 == 0) {
                            uVar26 = (uint)FStack_180.Chars;
                          }
                        }
                        if (local_188 == (undefined1  [8])TypeString) {
                          FString::~FString(&FStack_180);
                        }
                        FScanner::MustGetToken(sc,0x5d);
                        if ((int)uVar26 < 1) {
                          FScanner::ScriptMessage(sc,"Array size must be positive");
                          FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
                          uVar26 = 1;
                        }
                      }
                      type = NewArray((PType *)type,uVar26);
                    }
                    FScanner::MustGetToken(sc,0x3b);
                    local_188._0_4_ = iVar8;
                    lVar16 = (**(code **)((long)(local_190->super_PClass).super_PStruct.
                                                super_PNamedType.super_PCompoundType.super_PType.
                                                super_DObject._vptr_DObject + 0xa8))
                                       (local_190,(FWadCollection *)local_188,type);
                    pcVar10 = "\'%s\' is already defined in \'%s\'.";
                    if (lVar16 != 0) goto LAB_0069ce4e;
                  }
                  FScanner::ScriptMessage(sc,pcVar10,FName::NameData.NameArray[iVar8].Text);
                  FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
                  goto LAB_0069ce4e;
                }
                if (iVar8 == 0x127) {
                  ParseConstant(sc,local_168,local_190);
                }
                else {
                  if (iVar8 != 0x142) goto LAB_0069d3b2;
                  ParseEnum(sc,local_168,local_190);
                }
                goto LAB_0069ce4e;
              }
              if (iVar8 < 0x7d) {
                if ((iVar8 == 0x2b) || (iVar8 == 0x2d)) {
                  FScanner::MustGetString(sc);
                  FString::FString((FString *)local_188,sc->String);
                  bVar6 = FScanner::CheckString(sc,".");
                  if (bVar6) {
                    FScanner::MustGetString(sc);
                    pcVar10 = sc->String;
                  }
                  else {
                    pcVar10 = (char *)0x0;
                  }
                  HandleActorFlag(sc,(Baggage *)local_130,(char *)local_188,pcVar10,iVar8);
                  FString::~FString((FString *)local_188);
                }
                else {
LAB_0069d3b2:
                  FScanner::ScriptError(sc,"Unexpected \'%s\' in definition of \'%s\'",sc->String);
                }
                goto LAB_0069ce4e;
              }
              if (iVar8 == 0x101) {
                pcVar10 = sc->String;
                cVar7 = *pcVar10;
                if (cVar7 != '\0') {
                  do {
                    iVar8 = tolower((int)cVar7);
                    *pcVar10 = (char)iVar8;
                    cVar7 = pcVar10[1];
                    pcVar10 = pcVar10 + 1;
                  } while (cVar7 != '\0');
                  pcVar10 = sc->String;
                }
                FString::FString(&local_170,pcVar10);
                bVar6 = FScanner::CheckString(sc,".");
                if (bVar6) {
                  FScanner::MustGetString(sc);
                  FString::operator+=(&local_170,'.');
                  pcVar10 = sc->String;
                  cVar7 = *pcVar10;
                  if (cVar7 != '\0') {
                    do {
                      iVar8 = tolower((int)cVar7);
                      *pcVar10 = (char)iVar8;
                      cVar7 = pcVar10[1];
                      pcVar10 = pcVar10 + 1;
                    } while (cVar7 != '\0');
                    pcVar10 = sc->String;
                  }
                  FString::operator+=(&local_170,pcVar10);
                }
                else {
                  FScanner::UnGet(sc);
                }
                pFVar17 = FindProperty(local_170.Chars);
                if (pFVar17 == (FPropertyInfo *)0x0) {
                  iVar8 = MatchString(local_170.Chars,
                                      (char **)ParseActorProperty(FScanner&,Baggage&)::statenames);
                  pPVar12 = stack0xfffffffffffffed8;
                  statename.Chars = local_170.Chars;
                  if (iVar8 == -1) {
                    FScanner::ScriptError
                              (sc,"\"%s\" is an unknown actor property\n",local_170.Chars);
                  }
                  else {
                    bVar6 = FScanner::GetString(sc);
                    if (((!bVar6) || (sc->Crossed != false)) ||
                       (bVar6 = FScanner::Compare(sc,"0"), bVar6)) {
LAB_0069de15:
                      pFVar21 = (FState *)0x0;
                    }
                    else {
                      bVar6 = FScanner::Compare(sc,"PARENT");
                      if (!bVar6) {
                        FScanner::ScriptMessage(sc,"Invalid state assignment");
LAB_0069ddbf:
                        FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
                        goto LAB_0069de15;
                      }
                      FScanner::MustGetString(sc);
                      pPVar20 = dyn_cast<PClassActor>
                                          ((DObject *)(pPVar12->super_PClass).ParentClass);
                      if (pPVar20 == (PClassActor *)0x0) {
                        pFVar21 = (FState *)0x0;
                      }
                      else {
                        iVar8 = FName::NameManager::FindName(&FName::NameData,sc->String,false);
                        local_188._0_4_ = iVar8;
                        pFVar21 = PClassActor::FindState(pPVar20,1,(FName *)local_188,false);
                      }
                      bVar6 = FScanner::GetString(sc);
                      iVar8 = 0;
                      if (bVar6) {
                        bVar6 = FScanner::Compare(sc,"+");
                        if (bVar6) {
                          FScanner::MustGetNumber(sc);
                          iVar8 = sc->Number;
                        }
                        else {
                          FScanner::UnGet(sc);
                        }
                      }
                      if (pFVar21 == (FState *)0x0 && iVar8 == 0) goto LAB_0069de15;
                      if (iVar8 != 0 && pFVar21 == (FState *)0x0) {
                        FScanner::ScriptMessage
                                  (sc,"Attempt to get invalid state from actor %s\n",
                                   FName::NameData.NameArray
                                   [(((pPVar12->super_PClass).ParentClass)->super_PStruct).
                                    super_PNamedType.TypeName.Index].Text);
                        goto LAB_0069ddbf;
                      }
                      pFVar21 = pFVar21 + iVar8;
                    }
                    FStateDefinitions::SetStateLabel
                              ((FStateDefinitions *)local_110,statename.Chars,pFVar21,'\x01');
                  }
                }
                else {
                  pPVar12 = stack0xfffffffffffffed8;
                  if (stack0xfffffffffffffed8 != (PClassActor *)*pFVar17->cls) {
                    do {
                      pPVar12 = (PClassActor *)(pPVar12->super_PClass).ParentClass;
                      if (pPVar12 == (PClassActor *)*pFVar17->cls) break;
                    } while (pPVar12 != (PClassActor *)0x0);
                    if (pPVar12 == (PClassActor *)0x0) {
                      FScanner::ScriptMessage
                                (sc,"\"%s\" requires an actor of type \"%s\"\n",local_170.Chars);
                      FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
                      goto LAB_0069de2c;
                    }
                  }
                  local_138 = (AActor *)(stack0xfffffffffffffed8->super_PClass).Defaults;
                  if (ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::params == '\0'
                     ) {
                    ParseDecorate();
                  }
                  if (ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::strings ==
                      '\0') {
                    ParseDecorate();
                  }
                  if (DAT_00ab8d5c != 0) {
                    DAT_00ab8d5c = 0;
                  }
                  if (ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::strings._12_4_
                      != 0) {
                    TArray<FString,_FString>::DoDelete
                              ((TArray<FString,_FString> *)
                               ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::
                               strings,0,
                               ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::
                               strings._12_4_ - 1);
                    ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::strings._12_4_ =
                         0;
                  }
                  TArray<FPropParam,_FPropParam>::Grow
                            ((TArray<FPropParam,_FPropParam> *)
                             &ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::params
                             ,1);
                  DAT_00ab8d5c = DAT_00ab8d5c + 1;
                  *ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::params = 0;
                  pbVar24 = (byte *)pFVar17->params;
                  local_140 = pFVar17;
                  if ((*pbVar24 != 0) && (*pbVar24 != 0x30)) {
                    do {
                      local_198 = (FxDamageValue *)0x0;
                      local_178 = (LumpRecord *)0xffffffff;
                      FScriptPosition::FScriptPosition((FScriptPosition *)local_188,sc);
                      FScriptPosition::operator=(local_d0,(FScriptPosition *)local_188);
                      FString::~FString((FString *)local_188);
                      switch(*pbVar24 & 0xdf) {
                      case 0x43:
                        bVar6 = FScanner::CheckNumber(sc);
                        if (bVar6) {
                          iVar8 = sc->Number;
                          if (0xfe < iVar8) {
                            iVar8 = 0xff;
                          }
                          if (iVar8 < 1) {
                            iVar8 = 0;
                          }
                          FScanner::CheckString(sc,",");
                          FScanner::MustGetNumber(sc);
                          iVar9 = sc->Number;
                          if (0xfe < iVar9) {
                            iVar9 = 0xff;
                          }
                          if (iVar9 < 1) {
                            iVar9 = 0;
                          }
                          FScanner::CheckString(sc,",");
                          FScanner::MustGetNumber(sc);
                          uVar26 = sc->Number;
                          if (0xfe < (int)uVar26) {
                            uVar26 = 0xff;
                          }
                          if ((int)uVar26 < 1) {
                            uVar26 = 0;
                          }
                          local_198 = (FxDamageValue *)
                                      CONCAT44(local_198._4_4_,iVar9 << 8 | iVar8 << 0x10 | uVar26);
                          local_178 = (LumpRecord *)((ulong)local_178 & 0xffffffff00000000);
                        }
                        else {
                          FScanner::MustGetString(sc);
                          pcVar10 = sc->String;
                          uVar26 = TArray<FString,_FString>::Reserve
                                             ((TArray<FString,_FString> *)
                                              ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)
                                              ::strings,1);
                          pFVar18 = FString::operator=((FString *)
                                                       ((ulong)uVar26 * 8 +
                                                                                                              
                                                  ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)
                                                  ::strings._0_8_),pcVar10);
                          local_198 = (FxDamageValue *)pFVar18->Chars;
                          local_178 = (LumpRecord *)CONCAT44(local_178._4_4_,1);
                        }
LAB_0069da79:
                        TArray<FPropParam,_FPropParam>::Grow
                                  ((TArray<FPropParam,_FPropParam> *)
                                   &ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::
                                    params,1);
                        *(LumpRecord **)
                         (ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::params +
                         (ulong)DAT_00ab8d5c * 2) = local_178;
                        DAT_00ab8d5c = DAT_00ab8d5c + 1;
                        *ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::params =
                             *ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::params
                             + 1;
                        break;
                      default:
                        __assert_fail("false",
                                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_parse.cpp"
                                      ,0x3c8,
                                      "bool ParsePropertyParams(FScanner &, FPropertyInfo *, AActor *, Baggage &)"
                                     );
                      case 0x46:
                        FScanner::MustGetFloat(sc);
                        local_198 = (FxDamageValue *)sc->Float;
                        break;
                      case 0x49:
                        FScanner::MustGetNumber(sc);
                        iVar8 = sc->Number;
                        goto LAB_0069d94d;
                      case 0x4c:
                        bVar6 = FScanner::CheckNumber(sc);
                        if (bVar6) {
                          local_178 = (LumpRecord *)((ulong)local_178._4_4_ << 0x20);
                          local_198 = (FxDamageValue *)CONCAT44(local_198._4_4_,sc->Number);
                          goto LAB_0069da79;
                        }
                        local_178 = (LumpRecord *)CONCAT44(local_178._4_4_,1);
                        TArray<FPropParam,_FPropParam>::Grow
                                  ((TArray<FPropParam,_FPropParam> *)
                                   &ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::
                                    params,1);
                        *(LumpRecord **)
                         (ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::params +
                         (ulong)DAT_00ab8d5c * 2) = local_178;
                        DAT_00ab8d5c = DAT_00ab8d5c + 1;
                        *ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::params =
                             *ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::params
                             + 1;
                        do {
                          FScanner::MustGetString(sc);
                          pcVar10 = sc->String;
                          uVar26 = TArray<FString,_FString>::Reserve
                                             ((TArray<FString,_FString> *)
                                              ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)
                                              ::strings,1);
                          pFVar18 = FString::operator=((FString *)
                                                       ((ulong)uVar26 * 8 +
                                                                                                              
                                                  ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)
                                                  ::strings._0_8_),pcVar10);
                          pFVar19 = (FxDamageValue *)pFVar18->Chars;
                          TArray<FPropParam,_FPropParam>::Grow
                                    ((TArray<FPropParam,_FPropParam> *)
                                     &ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)
                                      ::params,1);
                          *(FxDamageValue **)
                           (ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::params +
                           (ulong)DAT_00ab8d5c * 2) = pFVar19;
                          DAT_00ab8d5c = DAT_00ab8d5c + 1;
                          *ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::params =
                               *ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::
                                params + 1;
                          bVar6 = FScanner::CheckString(sc,",");
                        } while (bVar6);
                        pbVar1 = pbVar24 + 2;
                        bVar30 = pbVar24[1] == 0x5f;
                        pbVar24 = pbVar24 + 1;
                        local_198 = pFVar19;
                        if (bVar30) {
                          pbVar24 = pbVar1;
                        }
                        goto LAB_0069dc12;
                      case 0x4d:
                        iVar8 = ParseFlagExpressionString
                                          (sc,(FParseValue *)ParseMorphStyle(FScanner&)::morphstyles
                                          );
                        goto LAB_0069d94d;
                      case 0x4e:
                        iVar8 = ParseFlagExpressionString
                                          (sc,(FParseValue *)
                                              ParseThingActivation(FScanner&)::activationstyles);
LAB_0069d94d:
                        local_198 = (FxDamageValue *)CONCAT44(local_198._4_4_,iVar8);
                        break;
                      case 0x53:
switchD_0069d7a1_caseD_53:
                        FScanner::MustGetString(sc);
                        pcVar10 = sc->String;
                        uVar26 = TArray<FString,_FString>::Reserve
                                           ((TArray<FString,_FString> *)
                                            ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)
                                            ::strings,1);
                        pFVar18 = FString::operator=((FString *)
                                                     ((ulong)uVar26 * 8 +
                                                                                                          
                                                  ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)
                                                  ::strings._0_8_),pcVar10);
                        local_198 = (FxDamageValue *)pFVar18->Chars;
                        break;
                      case 0x54:
                        FScanner::MustGetString(sc);
                        strbin1((char *)local_188);
                        uVar26 = TArray<FString,_FString>::Reserve
                                           ((TArray<FString,_FString> *)
                                            ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)
                                            ::strings,1);
                        pFVar18 = FString::operator=((FString *)
                                                     ((ulong)uVar26 * 8 +
                                                                                                          
                                                  ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)
                                                  ::strings._0_8_),(FString *)local_188);
                        local_198 = (FxDamageValue *)pFVar18->Chars;
                        FString::~FString((FString *)local_188);
                        break;
                      case 0x58:
                        bVar6 = FScanner::CheckString(sc,"(");
                        if (bVar6) {
                          pFVar19 = (FxDamageValue *)operator_new(0x50);
                          this = (FxIntCast *)operator_new(0x40);
                          pFVar14 = ParseExpression(sc,stack0xfffffffffffffed8,false);
                          FxIntCast::FxIntCast(this,pFVar14);
                          FxDamageValue::FxDamageValue(pFVar19,(FxExpression *)this,true);
                          FScanner::MustGetStringName(sc,")");
                        }
                        else {
                          FScanner::MustGetNumber(sc);
                          iVar8 = sc->Number;
                          if (iVar8 == 0) {
                            pFVar19 = (FxDamageValue *)0x0;
                          }
                          else {
                            pFVar19 = (FxDamageValue *)operator_new(0x50);
                            pFVar14 = (FxExpression *)operator_new(0x48);
                            FxExpression::FxExpression(pFVar14,local_d0);
                            pFVar14->_vptr_FxExpression = local_148;
                            pPVar2 = TypeSInt32;
                            pFVar14[1]._vptr_FxExpression = (_func_int **)TypeSInt32;
                            pFVar14->ValueType = (PType *)pPVar2;
                            *(int *)&pFVar14[1].JumpAddresses.Array = iVar8;
                            pFVar14->isresolved = true;
                            FxDamageValue::FxDamageValue(pFVar19,pFVar14,false);
                          }
                        }
                        local_198 = pFVar19;
                        TArray<FPropParam,_FPropParam>::Grow
                                  ((TArray<FPropParam,_FPropParam> *)
                                   &ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::
                                    params,1);
                        *(FxDamageValue **)
                         (ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::params +
                         (ulong)DAT_00ab8d5c * 2) = pFVar19;
                        DAT_00ab8d5c = DAT_00ab8d5c + 1;
                        break;
                      case 0x5a:
                        bVar6 = FScanner::CheckFloat(sc);
                        if (!bVar6) goto switchD_0069d7a1_caseD_53;
                        bVar6 = true;
                        FScanner::UnGet(sc);
                        goto LAB_0069dbc0;
                      }
                      bVar6 = false;
LAB_0069dbc0:
                      TArray<FPropParam,_FPropParam>::Grow
                                ((TArray<FPropParam,_FPropParam> *)
                                 &ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::
                                  params,1);
                      *(FxDamageValue **)
                       (ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::params +
                       (ulong)DAT_00ab8d5c * 2) = local_198;
                      DAT_00ab8d5c = DAT_00ab8d5c + 1;
                      *ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::params =
                           *ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::params +
                           1;
                      pbVar1 = pbVar24 + 2;
                      bVar30 = pbVar24[1] == 0x5f;
                      pbVar24 = pbVar24 + 1;
                      if (bVar30) {
                        pbVar24 = pbVar1;
                      }
                      if (!bVar6) {
LAB_0069dc12:
                        if (*pbVar24 == 0) break;
                        if ((char)*pbVar24 < 'a') {
                          if (bVar30) {
                            FScanner::CheckString(sc,",");
                          }
                          else {
                            FScanner::MustGetStringName(sc,",");
                          }
                        }
                        else {
                          bVar6 = FScanner::CheckString(sc,",");
                          if ((bool)(~bVar30 & 1) || bVar6) {
                            if (!bVar6) break;
                          }
                          else {
                            bVar6 = FScanner::CheckFloat(sc);
                            if (!bVar6) break;
                            FScanner::UnGet(sc);
                          }
                        }
                      }
                    } while (*pbVar24 != 0);
                  }
                  (*local_140->Handler)
                            (local_138,stack0xfffffffffffffed8,(Baggage *)local_130,
                             (FPropParam *)
                             ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::params)
                  ;
                }
LAB_0069de2c:
                FString::~FString(&local_170);
                goto LAB_0069ce4e;
              }
              if (iVar8 == 0x124) {
                local_188 = (undefined1  [8])0x0;
                FStack_180.Chars = (char *)0x0;
                if ((sc->LumpNum == -1) ||
                   (iVar8 = FWadCollection::GetLumpFile(&Wads,sc->LumpNum), 0 < iVar8)) {
                  FScanner::ScriptMessage
                            (sc,
                             "Action functions can only be imported by internal class and actor definitions!"
                            );
                  FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
                }
                FScanner::MustGetToken(sc,0x153);
                do {
                  bVar6 = FScanner::CheckToken(sc,0x132);
                  pPVar27 = (PFloat *)TypeBool;
                  if (bVar6) {
                    TArray<PType_*,_PType_*>::Grow((TArray<PType_*,_PType_*> *)local_188,1);
LAB_0069d00b:
                    (&(((PBasicType *)local_188)->super_PType).super_DObject._vptr_DObject)
                    [FStack_180.Chars._4_4_] = (_func_int **)pPVar27;
                    FStack_180.Chars._4_4_ = FStack_180.Chars._4_4_ + 1;
                  }
                  else {
                    bVar6 = FScanner::CheckToken(sc,0x13a);
                    pPVar27 = (PFloat *)TypeSInt32;
                    if (bVar6) {
                      TArray<PType_*,_PType_*>::Grow((TArray<PType_*,_PType_*> *)local_188,1);
                      goto LAB_0069d00b;
                    }
                    bVar6 = FScanner::CheckToken(sc,0x146);
                    pPVar27 = (PFloat *)TypeState;
                    if (bVar6) {
                      TArray<PType_*,_PType_*>::Grow((TArray<PType_*,_PType_*> *)local_188,1);
                      goto LAB_0069d00b;
                    }
                    bVar6 = FScanner::CheckToken(sc,0x133);
                    pPVar27 = TypeFloat64;
                    if (bVar6) {
                      TArray<PType_*,_PType_*>::Grow((TArray<PType_*,_PType_*> *)local_188,1);
                      goto LAB_0069d00b;
                    }
                  }
                  bVar6 = FScanner::CheckToken(sc,0x2c);
                } while (bVar6);
                FScanner::MustGetToken(sc,0x101);
                iVar8 = FName::NameManager::FindName(&FName::NameData,sc->String,false);
                local_198 = (FxDamageValue *)CONCAT44(local_198._4_4_,iVar8);
                ParseFunctionDef(sc,local_190,(FName *)&local_198,
                                 (TArray<PType_*,_PType_*> *)local_188,6);
LAB_0069d4ba:
                TArray<PType_*,_PType_*>::~TArray((TArray<PType_*,_PType_*> *)local_188);
                goto LAB_0069ce4e;
              }
              if (iVar8 != 0x7d) goto LAB_0069d3b2;
              FScriptPosition::FScriptPosition((FScriptPosition *)local_188,sc);
              FinishActor((FScriptPosition *)local_188,local_190,(Baggage *)local_130);
              FString::~FString((FString *)local_188);
              FScanner::SetCMode(sc,false);
              FString::~FString(&local_d0[0].FileName);
              TArray<FState,_FState>::~TArray((TArray<FState,_FState> *)(local_110 + 0x28));
              TArray<FStateDefine,_FStateDefine>::~TArray
                        ((TArray<FStateDefine,_FStateDefine> *)local_110);
              FString::~FString((FString *)local_130);
              goto LAB_0069e021;
            }
            bVar6 = FScanner::Compare(sc,"PICKUP");
            if (bVar6) {
              def = DEF_Pickup;
            }
            else {
              bVar6 = FScanner::Compare(sc,"BREAKABLE");
              if (bVar6) {
                def = DEF_BreakableDecoration;
              }
              else {
                bVar6 = FScanner::Compare(sc,"PROJECTILE");
                if (!bVar6) {
                  bVar6 = FScanner::Compare(sc,"DAMAGETYPE");
                  if (bVar6) {
                    FScanner::SetCMode(sc,true);
                    FScanner::MustGetString(sc);
                    uVar25 = 0;
                    iVar8 = FName::NameManager::FindName(&FName::NameData,sc->String,false);
                    FScanner::MustGetToken(sc,0x7b);
                    FScanner::MustGetAnyToken(sc);
                    local_190 = (PClassActor *)0x3ff0000000000000;
                    uVar23 = 0;
                    if (sc->TokenType != 0x7d) {
                      uVar23 = 0;
                      uVar25 = 0;
                      local_190 = (PClassActor *)0x3ff0000000000000;
                      do {
                        bVar6 = FScanner::Compare(sc,"FACTOR");
                        if (bVar6) {
                          FScanner::MustGetFloat(sc);
                          local_190 = (PClassActor *)sc->Float;
                          if (((double)local_190 == 0.0) && (!NAN((double)local_190))) {
LAB_0069e09f:
                            uVar25 = 1;
                          }
                        }
                        else {
                          bVar6 = FScanner::Compare(sc,"REPLACEFACTOR");
                          if (bVar6) goto LAB_0069e09f;
                          bVar6 = FScanner::Compare(sc,"NOARMOR");
                          if (bVar6) {
                            uVar23 = 1;
                          }
                          else {
                            FScanner::ScriptError
                                      (sc,"Unexpected data (%s) in damagetype definition.",
                                       sc->String);
                          }
                        }
                        FScanner::MustGetAnyToken(sc);
                      } while (sc->TokenType != 0x7d);
                    }
                    stack0xfffffffffffffed8 =
                         (PClassActor *)CONCAT71(CONCAT61(uStack_127._1_6_,uVar23),uVar25);
                    local_130._0_8_ = local_190;
                    local_188._0_4_ = iVar8;
                    DamageTypeDefinition::Apply
                              ((DamageTypeDefinition *)local_130,(FName *)local_188);
                    FScanner::SetCMode(sc,false);
                    goto LAB_0069e021;
                  }
                  goto LAB_0069e00a;
                }
                def = DEF_Projectile;
              }
            }
          }
          else {
LAB_0069e00a:
            FScanner::RestorePos(sc,&local_160);
            def = DEF_Decoration;
          }
          ParseOldDecoration(sc,def);
        }
      }
      else if (iVar8 == 0x127) {
        ParseConstant(sc,&GlobalSymbols,(PClassActor *)0x0);
      }
      else if (iVar8 == 0x142) {
        ParseEnum(sc,&GlobalSymbols,(PClassActor *)0x0);
      }
      else {
        if (iVar8 != 0x171) goto LAB_0069e00a;
        FScanner::MustGetString(sc);
        iVar8 = FWadCollection::GetLumpFile(&Wads,sc->LumpNum);
        if ((iVar8 == 0) &&
           (iVar8 = DArgs::CheckParm(Args,"-allowdecoratecrossincludes",1), iVar8 == 0)) {
          iVar8 = FWadCollection::CheckNumForFullName(&Wads,sc->String,true,0);
          iVar8 = FWadCollection::GetLumpFile(&Wads,iVar8);
          if (iVar8 != 0) {
            pcVar10 = FWadCollection::GetWadFullName(&Wads,iVar8);
            I_FatalError("File %s is overriding core lump %s.",pcVar10,sc->String);
          }
        }
        FScanner::FScanner((FScanner *)local_130);
        FScanner::Open((FScanner *)local_130,sc->String);
        ParseDecorate((FScanner *)local_130);
        FScanner::~FScanner((FScanner *)local_130);
      }
LAB_0069e021:
      SVar31 = FScanner::SavePos(sc);
      local_160.SavedScriptPtr = SVar31.SavedScriptPtr;
      local_160.SavedScriptLine = SVar31.SavedScriptLine;
      bVar6 = FScanner::GetToken(sc);
    } while (bVar6);
  }
  return;
}

Assistant:

void ParseDecorate (FScanner &sc)
{
	// Get actor class name.
	for(;;)
	{
		FScanner::SavedPos pos = sc.SavePos();
		if (!sc.GetToken ())
		{
			return;
		}
		switch (sc.TokenType)
		{
		case TK_Include:
		{
			sc.MustGetString();
			// This check needs to remain overridable for testing purposes.
			if (Wads.GetLumpFile(sc.LumpNum) == 0 && !Args->CheckParm("-allowdecoratecrossincludes"))
			{
				int includefile = Wads.GetLumpFile(Wads.CheckNumForFullName(sc.String, true));
				if (includefile != 0)
				{
					I_FatalError("File %s is overriding core lump %s.",
						Wads.GetWadFullName(includefile), sc.String);
				}
			}
			FScanner newscanner;
			newscanner.Open(sc.String);
			ParseDecorate(newscanner);
			break;
		}

		case TK_Const:
			ParseConstant (sc, &GlobalSymbols, NULL);
			break;

		case TK_Enum:
			ParseEnum (sc, &GlobalSymbols, NULL);
			break;

		case ';':
			// ';' is the start of a comment in the non-cmode parser which
			// is used to parse parts of the DECORATE lump. If we don't add 
			// a check here the user will only get weird non-informative
			// error messages if a semicolon is found.
			sc.ScriptError("Unexpected ';'");
			break;

		case TK_Identifier:
			// 'ACTOR' cannot be a keyword because it is also needed as a class identifier
			// so let's do a special case for this.
			if (sc.Compare("ACTOR"))
			{
				ParseActor (sc);
				break;
			}
			else if (sc.Compare("PICKUP"))
			{
				ParseOldDecoration (sc, DEF_Pickup);
				break;
			}
			else if (sc.Compare("BREAKABLE"))
			{
				ParseOldDecoration (sc, DEF_BreakableDecoration);
				break;
			}
			else if (sc.Compare("PROJECTILE"))
			{
				ParseOldDecoration (sc, DEF_Projectile);
				break;
			}
			else if (sc.Compare("DAMAGETYPE"))
			{
				ParseDamageDefinition(sc);
				break;
			}
		default:
			sc.RestorePos(pos);
			ParseOldDecoration(sc, DEF_Decoration);
			break;
		}
	}
}